

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O2

void __thiscall
spvtools::opt::CopyPropagateArrays::MemoryObject::
MemoryObject<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
          (MemoryObject *this,Instruction *var_inst,
          reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *begin,reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *end)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_10;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_8;
  
  this->variable_inst_ = var_inst;
  (this->access_chain_).
  super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->access_chain_).
  super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->access_chain_).
  super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8._M_current = (begin->current)._M_current;
  local_10._M_current = (end->current)._M_current;
  std::
  transform<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::back_insert_iterator<std::vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>>>,spvtools::opt::CopyPropagateArrays::MemoryObject::MemoryObject<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>(spvtools::opt::Instruction*,std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>)::_lambda(unsigned_int)_1_>
            (&local_8,&local_10,&this->access_chain_);
  return;
}

Assistant:

CopyPropagateArrays::MemoryObject::MemoryObject(Instruction* var_inst,
                                                iterator begin, iterator end)
    : variable_inst_(var_inst) {
  std::transform(begin, end, std::back_inserter(access_chain_),
                 [](uint32_t id) {
                   return AccessChainEntry{true, {id}};
                 });
}